

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

int ON_FontList::CompareQuartetName(ON_Font **lhs,ON_Font **rhs)

{
  wchar_t *string1;
  wchar_t *string2;
  undefined1 local_50 [24];
  undefined1 local_38 [16];
  ON_Font *rhs_font;
  ON_Font *lhs_font;
  ON_Font **rhs_local;
  ON_Font **lhs_local;
  
  if (lhs == rhs) {
    lhs_local._4_4_ = 0;
  }
  else if (lhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = 1;
  }
  else if (rhs == (ON_Font **)0x0) {
    lhs_local._4_4_ = -1;
  }
  else {
    rhs_font = *lhs;
    local_38._8_8_ = *rhs;
    if (rhs_font == (ON_Font *)local_38._8_8_) {
      lhs_local._4_4_ = 0;
    }
    else if (rhs_font == (ON_Font *)0x0) {
      lhs_local._4_4_ = 1;
    }
    else if ((ON_Font *)local_38._8_8_ == (ON_Font *)0x0) {
      lhs_local._4_4_ = -1;
    }
    else {
      lhs_font = (ON_Font *)rhs;
      rhs_local = lhs;
      ON_Font::QuartetName((ON_Font *)local_38);
      string1 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_38);
      ON_Font::QuartetName((ON_Font *)local_50);
      string2 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_50);
      lhs_local._4_4_ = ON_wString::CompareOrdinal(string1,string2,true);
      ON_wString::~ON_wString((ON_wString *)local_50);
      ON_wString::~ON_wString((ON_wString *)local_38);
    }
  }
  return lhs_local._4_4_;
}

Assistant:

int ON_FontList::CompareQuartetName(ON_Font const* const* lhs, ON_Font const* const* rhs)
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);
  return ON_wString::CompareOrdinal(
    lhs_font->QuartetName(), 
    rhs_font->QuartetName(),
    true
  );
}